

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O2

int has_top_right(AV1_COMMON *cm,MACROBLOCKD *xd,int mi_row,int mi_col,int bs)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar4 = 0;
  if (bs < 0x11) {
    uVar4 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
            [cm->seq_params->sb_size] - 1;
    uVar5 = mi_row & uVar4;
    uVar4 = mi_col & uVar4;
    bVar3 = (uVar4 & bs) == 0 || (uVar5 & bs) == 0;
    do {
      uVar6 = bs;
      if (((int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                      [cm->seq_params->sb_size] <= (int)uVar6) || ((uVar6 & uVar4) == 0))
      goto LAB_0032fe3b;
      bs = uVar6 * 2;
    } while ((bs & uVar5) == 0 || (bs & uVar4) == 0);
    bVar3 = false;
LAB_0032fe3b:
    bVar1 = xd->width;
    bVar2 = xd->height;
    if (bVar1 < bVar2) {
      bVar3 = xd->is_last_vertical_rect ^ 1U | bVar3;
    }
    if (bVar2 < bVar1) {
      bVar3 = bVar3 & xd->is_first_horizontal_rect;
    }
    if ((*xd->mi)->partition == '\x06') {
      bVar3 = ((uVar6 & uVar5) == 0 || bVar1 != bVar2) & bVar3;
    }
    uVar4 = bVar3 & 1;
  }
  return uVar4;
}

Assistant:

static int has_top_right(const AV1_COMMON *cm, const MACROBLOCKD *xd,
                         int mi_row, int mi_col, int bs) {
  const int sb_mi_size = mi_size_wide[cm->seq_params->sb_size];
  const int mask_row = mi_row & (sb_mi_size - 1);
  const int mask_col = mi_col & (sb_mi_size - 1);

  if (bs > mi_size_wide[BLOCK_64X64]) return 0;

  // In a split partition all apart from the bottom right has a top right
  int has_tr = !((mask_row & bs) && (mask_col & bs));

  // bs > 0 and bs is a power of 2
  assert(bs > 0 && !(bs & (bs - 1)));

  // For each 4x4 group of blocks, when the bottom right is decoded the blocks
  // to the right have not been decoded therefore the bottom right does
  // not have a top right
  while (bs < sb_mi_size) {
    if (mask_col & bs) {
      if ((mask_col & (2 * bs)) && (mask_row & (2 * bs))) {
        has_tr = 0;
        break;
      }
    } else {
      break;
    }
    bs <<= 1;
  }

  // In a VERTICAL or VERTICAL_4 partition, all partition before the last one
  // always have a top right (as the block above will have been decoded).
  if (xd->width < xd->height) {
    if (!xd->is_last_vertical_rect) has_tr = 1;
  }

  // In a HORIZONTAL or HORIZONTAL_4 partition, partitions after the first one
  // never have a top right (as the block to the right won't have been decoded).
  if (xd->width > xd->height) {
    if (!xd->is_first_horizontal_rect) has_tr = 0;
  }

  // The bottom left square of a Vertical A (in the old format) does
  // not have a top right as it is decoded before the right hand
  // rectangle of the partition
  if (xd->mi[0]->partition == PARTITION_VERT_A) {
    if (xd->width == xd->height)
      if (mask_row & bs) has_tr = 0;
  }

  return has_tr;
}